

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O3

void bs_predict_mean(vw *all,example *ec,vector<double,_std::allocator<double>_> *pred_vec)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  float fVar4;
  float extraout_XMM0_Da;
  double dVar5;
  
  pdVar1 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 == pdVar2) {
    fVar4 = 0.0;
  }
  else {
    dVar5 = 0.0;
    pdVar3 = pdVar1;
    do {
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != pdVar2);
    fVar4 = (float)dVar5;
  }
  (ec->pred).scalar = fVar4 / (float)(ulong)((long)pdVar2 - (long)pdVar1 >> 3);
  if ((0.0 < ec->weight) && ((fVar4 = (ec->l).simple.label, fVar4 != 3.4028235e+38 || (NAN(fVar4))))
     ) {
    (*all->loss->_vptr_loss_function[1])(all->loss,all->sd);
    ec->loss = extraout_XMM0_Da * ec->weight;
  }
  return;
}

Assistant:

void bs_predict_mean(vw& all, example& ec, vector<double>& pred_vec)
{
  ec.pred.scalar = (float)accumulate(pred_vec.cbegin(), pred_vec.cend(), 0.0) / pred_vec.size();
  if (ec.weight > 0 && ec.l.simple.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ec.l.simple.label) * ec.weight;
}